

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl.h
# Opt level: O2

void __thiscall YAML::Node::EnsureNodeExists(Node *this)

{
  memory_holder *this_00;
  node *this_01;
  InvalidNode *this_02;
  
  if (this->m_isValid == false) {
    this_02 = (InvalidNode *)__cxa_allocate_exception(0x40);
    InvalidNode::InvalidNode(this_02,&this->m_invalidKey);
    __cxa_throw(this_02,&InvalidNode::typeinfo,BadConversion::~BadConversion);
  }
  if (this->m_pNode != (node *)0x0) {
    return;
  }
  this_00 = (memory_holder *)operator_new(0x10);
  detail::memory_holder::memory_holder(this_00);
  std::__shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>::
  reset<YAML::detail::memory_holder>
            (&(this->m_pMemory).
              super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>,this_00);
  this_01 = detail::memory_holder::create_node
                      ((this->m_pMemory).
                       super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
  this->m_pNode = this_01;
  detail::node::set_null(this_01);
  return;
}

Assistant:

inline void Node::EnsureNodeExists() const {
  if (!m_isValid)
    throw InvalidNode(m_invalidKey);
  if (!m_pNode) {
    m_pMemory.reset(new detail::memory_holder);
    m_pNode = &m_pMemory->create_node();
    m_pNode->set_null();
  }
}